

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

ChaiScript_Basic * __thiscall
chaiscript::ChaiScript_Basic::add<chaiscript::Boxed_Value>
          (ChaiScript_Basic *this,Boxed_Value *t_t,string *t_name)

{
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  Name_Validator::validate_object_name<std::__cxx11::string>(t_name);
  Catch::clara::std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_38,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_t);
  detail::Dispatch_Engine::add(&this->m_engine,(Boxed_Value *)&_Stack_38,t_name);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_38._M_refcount);
  return this;
}

Assistant:

ChaiScript_Basic &add(const T &t_t, const std::string &t_name) {
      Name_Validator::validate_object_name(t_name);
      m_engine.add(t_t, t_name);
      return *this;
    }